

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

bool __thiscall
cli::Parser::CmdFunction<bool>::parse(CmdFunction<bool> *this,ostream *output,ostream *error)

{
  bool bVar1;
  CallbackArgs args;
  CallbackArgs local_20;
  
  local_20.arguments = &(this->super_CmdBase).arguments;
  local_20.output = output;
  local_20.error = error;
  bVar1 = std::function<bool_(cli::CallbackArgs_&)>::operator()(&this->callback,&local_20);
  this->value = bVar1;
  return true;
}

Assistant:

virtual bool parse(std::ostream& output, std::ostream& error) {
				try {
					CallbackArgs args { arguments, output, error };
					value = callback(args);
					return true;
				} catch (...) {
					return false;
				}
			}